

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> * __thiscall
linq::IEnumerable<int>::Take
          (IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *__return_storage_ptr__,
          IEnumerable<int> *this,size_t count)

{
  IEnumerable<int> local_30;
  
  IEnumerable(&local_30,this);
  IEnumerableCore<linq::IEnumerable<int>_>::Take
            (__return_storage_ptr__,(IEnumerableCore<linq::IEnumerable<int>_> *)&local_30,count);
  ~IEnumerable(&local_30);
  return __return_storage_ptr__;
}

Assistant:

IEnumerableCore<TakeState<IEnumerable<T>, T>> IEnumerable<T>::Take(size_t count) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Take(count); }